

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screenshot.c
# Opt level: O3

void take_screenshot(SCREENSHOT *ss)

{
  undefined8 uVar1;
  undefined8 uVar2;
  char buf [64];
  char acStack_68 [72];
  
  snprintf(acStack_68,0x40,"%s%04d.%s",ss->name,(ulong)(uint)ss->counter,ss->ext);
  uVar1 = al_create_bitmap(screen_width,screen_height);
  al_set_target_bitmap(uVar1);
  uVar2 = al_get_backbuffer(screen);
  al_draw_bitmap(0,0,uVar2,0);
  al_set_target_backbuffer(screen);
  al_save_bitmap(acStack_68,uVar1);
  al_destroy_bitmap(uVar1);
  next_screenshot(ss);
  return;
}

Assistant:

void take_screenshot(SCREENSHOT * ss)
{
   char buf[64];
   ALLEGRO_BITMAP *bmp2 = NULL;

   snprintf(buf, sizeof(buf), "%s%04d.%s", ss->name, ss->counter, ss->ext);

   bmp2 = al_create_bitmap(screen_width, screen_height);
   al_set_target_bitmap(bmp2);
   al_draw_bitmap(al_get_backbuffer(screen), 0, 0, 0);
   al_set_target_backbuffer(screen);
   al_save_bitmap(buf, bmp2);
   al_destroy_bitmap(bmp2);

   next_screenshot(ss);
}